

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O1

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingFullyOpaquePixelIsCopied
          (GenericRGBXBlenderTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FailedAssertion *pFVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  color local_b4;
  color local_b0;
  color local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  color local_9c;
  string local_98;
  string local_78;
  LocationInfo local_58;
  
  local_9c = color::make('\x10',' ','0',0xff);
  local_ac = color::make('\x10',' ','0',0xff);
  local_b0 = color::make('\x10',' ','0',0xff);
  local_b4 = color::make('\x10',' ','0',0xff);
  iVar4 = ((uint)local_9c >> 0x18) * 0x40 + (((uint)local_9c >> 0x18) * 0x1f9) / 1000;
  if (iVar4 == 0x4040) {
    uVar9 = (uint)local_9c >> 8;
    uVar6 = (uint)local_9c >> 0x10;
  }
  else {
    uVar6 = (uint)local_9c >> 0x10;
    uVar9 = (uint)local_9c >> 8;
    iVar4 = iVar4 * 0xff;
    local_9c = (color)(((uint)local_9c & 0xff) * iVar4 >> 0x16);
    uVar9 = (uVar9 & 0xff) * iVar4 >> 0x16;
    uVar6 = iVar4 * (uVar6 & 0xff) >> 0x16;
  }
  iVar4 = (((uint)local_ac >> 0x18) * 0x1f9) / 1000 + ((uint)local_ac >> 0x18) * 0x40;
  if (iVar4 == 0x4040) {
    local_a0 = (uint)local_ac >> 8;
    uVar10 = (uint)local_ac >> 0x10;
  }
  else {
    uVar10 = (uint)local_ac >> 0x10;
    uVar8 = (uint)local_ac >> 8;
    iVar4 = iVar4 * 0xff;
    local_ac = (color)(((uint)local_ac & 0xff) * iVar4 >> 0x16);
    local_a0 = (uVar8 & 0xff) * iVar4 >> 0x16;
    uVar10 = iVar4 * (uVar10 & 0xff) >> 0x16;
  }
  iVar4 = (((uint)local_b0 >> 0x18) * 0x1f9) / 1000 + ((uint)local_b0 >> 0x18) * 0x40;
  if (iVar4 == 0x4040) {
    local_a4 = (uint)local_b0 >> 8;
    uVar8 = (uint)local_b0 >> 0x10;
  }
  else {
    uVar8 = (uint)local_b0 >> 0x10;
    uVar5 = (uint)local_b0 >> 8;
    iVar4 = iVar4 * 0xff;
    local_b0 = (color)(((uint)local_b0 & 0xff) * iVar4 >> 0x16);
    local_a4 = (uVar5 & 0xff) * iVar4 >> 0x16;
    uVar8 = iVar4 * (uVar8 & 0xff) >> 0x16;
  }
  iVar4 = (((uint)local_b4 >> 0x18) * 0x1f9) / 1000 + ((uint)local_b4 >> 0x18) * 0x40;
  if (iVar4 == 0x4040) {
    local_a8 = (uint)local_b4 >> 8;
    uVar5 = (uint)local_b4 >> 0x10;
  }
  else {
    uVar5 = (uint)local_b4 >> 0x10;
    uVar7 = (uint)local_b4 >> 8;
    iVar4 = iVar4 * 0xff;
    local_b4 = (color)(((uint)local_b4 & 0xff) * iVar4 >> 0x16);
    local_a8 = (uVar7 & 0xff) * iVar4 >> 0x16;
    uVar5 = iVar4 * (uVar5 & 0xff) >> 0x16;
  }
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0x85);
  if (((local_9c.r != '\x10') || ((uVar9 & 0xff) != 0x20)) || ((uVar6 & 0xff) != 0x30)) {
    pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar3,&local_78,&local_58);
    __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_58.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0x86);
  if (((local_ac.r != '\x10') || ((local_a0 & 0xff) != 0x20)) || ((uVar10 & 0xff) != 0x30)) {
    pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar3,&local_78,&local_58);
    __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0x87);
  if (((local_b0.r == '\x10') && ((local_a4 & 0xff) == 0x20)) && ((uVar8 & 0xff) == 0x30)) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_58.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_58,&local_98,0x88);
    if (((local_b4.r == '\x10') && ((local_a8 & 0xff) == 0x20)) && ((uVar5 & 0xff) == 0x30)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.filename._M_dataplus._M_p != paVar2) {
        operator_delete(local_58.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      return;
    }
    pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar3,&local_78,&local_58);
    __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar3 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar3,&local_78,&local_58);
  __cxa_throw(pFVar3,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( BlendingFullyOpaquePixelIsCopied )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel1;
				typedef mocks::pixel_rgbx<order_bgra> pixel2;
				typedef mocks::pixel_rgbx<order_argb> pixel3;
				typedef mocks::pixel_rgbx<order_abgr> pixel4;

				// INIT
				const uint8_t cover = 0xFF;
				blender_solid_color_rgb<pixel1, order_rgba> b1(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel2, order_bgra> b2(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel3, order_argb> b3(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel4, order_abgr> b4(color::make(0x10, 0x20, 0x30));
				pixel1 dest1 = { };
				pixel2 dest2 = { };
				pixel3 dest3 = { };
				pixel4 dest4 = { };

				// ACT
				b1(&dest1, 0, 0, 1, &cover);
				b2(&dest2, 0, 0, 1, &cover);
				b3(&dest3, 0, 0, 1, &cover);
				b4(&dest4, 0, 0, 1, &cover);

				// ASSERT
				pixel1 reference1 = { { 0x10, 0x20, 0x30 } };
				pixel2 reference2 = { { 0x30, 0x20, 0x10 } };
				pixel3 reference3 = { { 0, 0x10, 0x20, 0x30 } };
				pixel4 reference4 = { { 0, 0x30, 0x20, 0x10 } };

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
				assert_equal(reference3, dest3);
				assert_equal(reference4, dest4);
			}